

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool extract_if_dead(connectdata *conn,Curl_easy *data)

{
  _func_uint_connectdata_ptr_uint *p_Var1;
  uint uVar2;
  int iVar3;
  _Bool _Var4;
  
  if (((conn->easyq).size == 0) && (conn->data == (Curl_easy *)0x0)) {
    p_Var1 = conn->handler->connection_check;
    if (p_Var1 == (_func_uint_connectdata_ptr_uint *)0x0) {
      iVar3 = Curl_socket_check(conn->sock[0],-1,-1,0);
      if (iVar3 == 0) {
        return false;
      }
    }
    else {
      conn->data = data;
      uVar2 = (*p_Var1)(conn,1);
      conn->data = (Curl_easy *)0x0;
      if ((uVar2 & 1) == 0) goto LAB_00493c98;
    }
    Curl_infof(data,"Connection %ld seems to be dead!\n",conn->connection_id);
    Curl_conncache_remove_conn(data,conn,false);
    _Var4 = true;
  }
  else {
LAB_00493c98:
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

static bool extract_if_dead(struct connectdata *conn,
                            struct Curl_easy *data)
{
  if(!CONN_INUSE(conn) && !conn->data) {
    /* The check for a dead socket makes sense only if the connection isn't in
       use */
    bool dead;
    if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;
      struct Curl_easy *olddata = conn->data;
      conn->data = data; /* use this transfer for now */
      state = conn->handler->connection_check(conn, CONNCHECK_ISDEAD);
      conn->data = olddata;
      dead = (state & CONNRESULT_DEAD);
    }
    else {
      /* Use the general method for determining the death of a connection */
      dead = SocketIsDead(conn->sock[FIRSTSOCKET]);
    }

    if(dead) {
      infof(data, "Connection %ld seems to be dead!\n", conn->connection_id);
      Curl_conncache_remove_conn(data, conn, FALSE);
      return TRUE;
    }
  }
  return FALSE;
}